

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLColladaParserAutoGen15PrivateEnums.cpp
# Opt level: O2

ENUM__gles_sampler_wrap_enum
COLLADASaxFWL15::toEnum_ENUM__gles_sampler_wrap_enum
          (ParserChar **buffer,ParserChar *bufferEnd,bool *failed,
          pair<unsigned_long,_COLLADASaxFWL15::ENUM__gles_sampler_wrap_enum> *enumMap,
          _func_StringHash_ParserChar_ptr_ptr_ParserChar_ptr_bool_ptr *baseConversionFunc)

{
  long lVar1;
  StringHash SVar2;
  long lVar3;
  
  SVar2 = (*baseConversionFunc)(buffer,bufferEnd,failed);
  lVar1 = 0;
  do {
    lVar3 = lVar1;
    if (lVar3 + 0x10 == 0x50) {
      *failed = true;
      return ENUM__gles_sampler_wrap_enum__COUNT;
    }
    lVar1 = lVar3 + 0x10;
  } while (*(StringHash *)((long)&enumMap->first + lVar3) != SVar2);
  *failed = false;
  return *(ENUM__gles_sampler_wrap_enum *)((long)&enumMap->second + lVar3);
}

Assistant:

ENUM__gles_sampler_wrap_enum toEnum_ENUM__gles_sampler_wrap_enum (
    const ParserChar** buffer,
    const ParserChar* bufferEnd,
    bool& failed,
    const std::pair<StringHash, ENUM__gles_sampler_wrap_enum>* enumMap,
    StringHash (*baseConversionFunc)( const ParserChar**, const ParserChar*, bool& )
)
{
    return Utils::toEnum<ENUM__gles_sampler_wrap_enum, StringHash, ENUM__gles_sampler_wrap_enum__COUNT>(buffer, bufferEnd, failed, enumMap, baseConversionFunc);
}